

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

U32 ZSTD_rawLiteralsCost(BYTE *literals,U32 litLength,optState_t *optPtr,int optLevel)

{
  uint uVar1;
  int iVar2;
  U32 UVar3;
  uint uVar4;
  undefined4 in_register_00000034;
  long *plVar5;
  
  plVar5 = (long *)CONCAT44(in_register_00000034,litLength);
  UVar3 = 0x800;
  if (((int)plVar5[0xc] != 2) && (UVar3 = 0x600, (int)plVar5[10] != 1)) {
    uVar4 = *(int *)(*plVar5 + (ulong)*literals * 4) + 1;
    if ((int)optPtr == 0) {
      if (uVar4 == 0) goto LAB_00176222;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar4 = iVar2 << 8;
    }
    else {
      if (uVar4 == 0) {
LAB_00176222:
        __assert_fail("val != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x12c2,"U32 ZSTD_highbit32(U32)");
      }
      uVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      if (0x16 < uVar1) {
        __assert_fail("hb + BITCOST_ACCURACY < 31",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x45cb,"U32 ZSTD_fracWeight(U32)");
      }
      uVar4 = (uVar4 * 0x100 >> ((byte)uVar1 & 0x1f)) + uVar1 * 0x100;
    }
    if (*(uint *)(plVar5 + 8) < uVar4) {
      __assert_fail("WEIGHT(optPtr->litFreq[literals[u]], optLevel) <= optPtr->litSumBasePrice",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x467d,
                    "U32 ZSTD_rawLiteralsCost(const BYTE *const, const U32, const optState_t *const, int)"
                   );
    }
    UVar3 = *(uint *)(plVar5 + 8) - uVar4;
  }
  return UVar3;
}

Assistant:

static U32 ZSTD_rawLiteralsCost(const BYTE* const literals, U32 const litLength,
                                const optState_t* const optPtr,
                                int optLevel)
{
    if (litLength == 0) return 0;

    if (!ZSTD_compressedLiterals(optPtr))
        return (litLength << 3) * BITCOST_MULTIPLIER;  /* Uncompressed - 8 bytes per literal. */

    if (optPtr->priceType == zop_predef)
        return (litLength*6) * BITCOST_MULTIPLIER;  /* 6 bit per literal - no statistic used */

    /* dynamic statistics */
    {   U32 price = litLength * optPtr->litSumBasePrice;
        U32 u;
        for (u=0; u < litLength; u++) {
            assert(WEIGHT(optPtr->litFreq[literals[u]], optLevel) <= optPtr->litSumBasePrice);   /* literal cost should never be negative */
            price -= WEIGHT(optPtr->litFreq[literals[u]], optLevel);
        }
        return price;
    }
}